

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.h
# Opt level: O0

void StackBackTraceNode::PrintAll(StackBackTraceNode *head)

{
  StackBackTraceNode *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackBackTraceNode *next_1;
  StackBackTraceNode *next;
  StackBackTraceNode *prev;
  StackBackTraceNode *curr;
  StackBackTraceNode *head_local;
  
  next = (StackBackTraceNode *)0x0;
  prev = head;
  while (prev != (StackBackTraceNode *)0x0) {
    pSVar1 = prev->next;
    prev->next = next;
    next = prev;
    prev = pSVar1;
  }
  prev = next;
  next = (StackBackTraceNode *)0x0;
  while (prev != (StackBackTraceNode *)0x0) {
    StackBackTrace::Print(prev->stackBackTrace);
    pSVar1 = prev->next;
    prev->next = next;
    next = prev;
    prev = pSVar1;
  }
  if (next != head) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/StackBackTrace.h"
                       ,0x79,"(prev == head)","prev == head");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

static void PrintAll(StackBackTraceNode * head)
    {
        // We want to print them tail first because that is the first stack trace we added

        // Reverse the list
        StackBackTraceNode * curr = head;
        StackBackTraceNode * prev = nullptr;
        while (curr != nullptr)
        {
            StackBackTraceNode * next = curr->next;
            curr->next = prev;
            prev = curr;
            curr = next;
        }

        // print and reverse again.
        curr = prev;
        prev = nullptr;
        while (curr != nullptr)
        {
            curr->stackBackTrace->Print();
            StackBackTraceNode * next = curr->next;
            curr->next = prev;
            prev = curr;
            curr = next;
        }

        Assert(prev == head);
    }